

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O1

void shuffle_filter_odd_ssse3(int16_t *filter,__m128i *f)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  auVar1 = *(undefined1 (*) [16])filter;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_0056a030);
  *f = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_0056a040);
  f[1] = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_0056a050);
  f[2] = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_0056a060);
  f[3] = alVar2;
  alVar2 = (__m128i)pshufb(auVar1,_DAT_0056a070);
  f[4] = alVar2;
  return;
}

Assistant:

static inline void shuffle_filter_odd_ssse3(const int16_t *const filter,
                                            __m128i *const f) {
  const __m128i f_values = _mm_load_si128((const __m128i *)filter);
  // pack and duplicate the filter values
  // It utilizes the fact that the high byte of filter[3] is always 0 to clean
  // half of f[0] and f[4].
  assert(filter[3] >= 0 && filter[3] < 256);
  f[0] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0007u));
  f[1] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0402u));
  f[2] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0806u));
  f[3] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0c0au));
  f[4] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x070eu));
}